

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

void __thiscall BGIPSolution::AddSolution(BGIPSolution *this,LIndex jpolIndex,double value)

{
  long *in_RDI;
  JointPolicyPureVector jp_1;
  JointPolicyPureVector jp;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_stack_fffffffffffffe78;
  JointPolicyPureVector *in_stack_fffffffffffffe80;
  JointPolicyPureVector *this_00;
  Interface_ProblemToPolicyDiscretePure *in_stack_fffffffffffffea8;
  JointPolicyPureVector *in_stack_fffffffffffffeb0;
  I_PtPDpure_constPtr *in_stack_fffffffffffffeb8;
  JointPolicyPureVector *in_stack_fffffffffffffec0;
  double in_stack_ffffffffffffff50;
  JointPolicyPureVector *in_stack_ffffffffffffff58;
  BGIPSolution *in_stack_ffffffffffffff60;
  
  if (*in_RDI == 0) {
    this_00 = (JointPolicyPureVector *)&stack0xfffffffffffffe98;
    boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::shared_ptr
              ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)this_00,
               in_stack_fffffffffffffe78);
    JointPolicyPureVector::JointPolicyPureVector
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x8d096d);
    JointPolicyPureVector::SetIndex(this_00,(LIndex)in_stack_fffffffffffffe78);
    AddSolution(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    JointPolicyPureVector::~JointPolicyPureVector(this_00);
  }
  else {
    JointPolicyPureVector::JointPolicyPureVector
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    JointPolicyPureVector::SetIndex(in_stack_fffffffffffffe80,(LIndex)in_stack_fffffffffffffe78);
    AddSolution(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    JointPolicyPureVector::~JointPolicyPureVector(in_stack_fffffffffffffe80);
  }
  return;
}

Assistant:

void BGIPSolution::AddSolution(LIndex jpolIndex, double value)
{
    if(_m_pu)
    {
        JointPolicyPureVector jp=JointPolicyPureVector(_m_pu); 
        jp.SetIndex(jpolIndex);
        AddSolution(jp,value);
    }
    else
    {
        JointPolicyPureVector jp=JointPolicyPureVector(_m_puShared);
        jp.SetIndex(jpolIndex);
        AddSolution(jp,value);
    }
}